

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O2

void __thiscall
cfdcapi_transaction_FundRawTransaction_Check2_Test::TestBody
          (cfdcapi_transaction_FundRawTransaction_Check2_Test *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  void *fund_handle_00;
  void *handle_00;
  int iVar3;
  pointer pCVar4;
  char *pcVar5;
  char *in_R9;
  CfdTestFundElementsUtxoVector *test_data;
  pointer pCVar6;
  long lVar7;
  int64_t tx_fee_amount;
  char *output_tx_hex;
  int ret;
  AssertHelper local_160;
  void *fund_handle;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  AssertionResult gtest_ar_;
  void *handle;
  AssertHelper local_120;
  uint32_t append_txout_count;
  AssertionResult gtest_ar;
  undefined4 local_f0 [2];
  undefined8 uStack_e8;
  string local_e0;
  string local_c0 [32];
  string local_a0 [32];
  undefined4 local_80;
  undefined8 local_78;
  string local_70;
  string local_50 [32];
  
  if (TestBody()::exp_dummy_asset_a == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::exp_dummy_asset_a);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,
                 "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
                 (allocator *)&gtest_ar_);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                (&TestBody::exp_dummy_asset_a,(string *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      __cxa_atexit(cfd::core::ConfidentialAssetId::~ConfidentialAssetId,&TestBody::exp_dummy_asset_a
                   ,&__dso_handle);
      __cxa_guard_release(&TestBody()::exp_dummy_asset_a);
    }
  }
  if (TestBody()::kFundCoinSelectElementsTestVector3 == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)&gtest_ar,
                 "2bc630021e76ab6bd7f8da54b0c59381e0265b093629e4384207030adba99775",
                 (allocator *)&gtest_ar_);
      local_f0[0] = 0;
      uStack_e8 = 150000000;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_e0,&TestBody::exp_dummy_asset_a);
      std::__cxx11::string::string
                (local_c0,
                 "sh(wpkh([b8f7f84b/0\'/0\'/4\']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5"
                 ,(allocator *)&handle);
      std::__cxx11::string::string
                (local_a0,"42120c9e8adc1d0f0d843617a0c91d699a1eb67fb744dde21103d6423fa5c8c5",
                 (allocator *)&fund_handle);
      local_80 = 1;
      local_78 = 150000000;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_70,&TestBody::exp_dummy_asset_a);
      std::__cxx11::string::string
                (local_50,
                 "sh(wpkh([b8f7f84b/0\'/0\'/4\']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5"
                 ,(allocator *)&tx_fee_amount);
      TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pCVar4 = (pointer)operator_new(0xe0);
      TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar4 + 2;
      TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
      ._M_impl.super__Vector_impl_data._M_start = pCVar4;
      for (lVar7 = 0; pCVar6 = (pointer)((long)&(pCVar4->txid)._M_dataplus._M_p + lVar7),
          lVar7 != 0xe0; lVar7 = lVar7 + 0x70) {
        std::__cxx11::string::string((string *)pCVar6,(string *)(&gtest_ar.success_ + lVar7));
        uVar2 = *(undefined8 *)((long)&uStack_e8 + lVar7);
        puVar1 = (undefined8 *)((long)&pCVar4->vout + lVar7);
        *puVar1 = *(undefined8 *)((long)local_f0 + lVar7);
        puVar1[1] = uVar2;
        std::__cxx11::string::string
                  ((string *)((long)&(pCVar4->asset)._M_dataplus._M_p + lVar7),
                   (string *)((long)&local_e0._M_dataplus._M_p + lVar7));
        std::__cxx11::string::string
                  ((string *)((long)&(pCVar4->descriptor)._M_dataplus._M_p + lVar7),local_c0 + lVar7
                  );
      }
      lVar7 = 0x70;
      TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
      ._M_impl.super__Vector_impl_data._M_finish = pCVar6;
      do {
        TestBody::CfdTestFundElementsUtxoVector::~CfdTestFundElementsUtxoVector
                  ((CfdTestFundElementsUtxoVector *)(&gtest_ar.success_ + lVar7));
        lVar7 = lVar7 + -0x70;
      } while (lVar7 != -0x70);
      __cxa_atexit(std::
                   vector<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
                   ::~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
      __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
    }
  }
  if (TestBody()::kExpTxData_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)&TestBody()::kExpTxData_abi_cxx11_,
                 "0200000000027597a9db0a03074238e42936095b26e08193c5b054daf8d76bab761e0230c62b0000000000ffffffffc5c8a53f42d60311e2dd44b77fb61e9a691dc9a01736840d0f1ddc8a9e0c12420100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007be00000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000bebba420230646d493a7ed8cb0091ad6e8feedcc9cd17a9162e61b7cff7929697792ef64217a91497dfc3937ad66e142925a76489eebc75358bca338700000000"
                 ,(allocator *)&gtest_ar);
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
    }
  }
  CfdInitialize();
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fund_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x77a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fund_handle,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fund_handle);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&fund_handle);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_fee_amount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x77b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&tx_fee_amount,(Message *)&fund_handle);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_fee_amount);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&fund_handle);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar,&TestBody::exp_dummy_asset_a);
  fund_handle = (void *)0x0;
  ret = CfdInitializeFundRawTx
                  (handle,0xb,1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),&fund_handle);
  tx_fee_amount = (ulong)tx_fee_amount._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&tx_fee_amount);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x785,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tx_fee_amount);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  tx_fee_amount = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((internal *)&gtest_ar_,"nullptr","fund_handle",(void **)&tx_fee_amount,&fund_handle);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&tx_fee_amount);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x786,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tx_fee_amount);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  pCVar4 = TestBody::kFundCoinSelectElementsTestVector3.
           super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ret == 0) {
    pCVar6 = TestBody::kFundCoinSelectElementsTestVector3.
             super__Vector_base<CfdTestFundElementsUtxoVector,_std::allocator<CfdTestFundElementsUtxoVector>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      handle_00 = handle;
      fund_handle_00 = fund_handle;
      if (pCVar6 == pCVar4) break;
      ret = CfdAddUtxoForFundRawTx
                      (handle,fund_handle,(pCVar6->txid)._M_dataplus._M_p,pCVar6->vout,
                       pCVar6->amount,(pCVar6->descriptor)._M_dataplus._M_p,
                       (pCVar6->asset)._M_dataplus._M_p);
      tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&tx_fee_amount);
        pcVar5 = "";
        if (gtest_ar_.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x78f,pcVar5);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&tx_fee_amount);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      pCVar6 = pCVar6 + 1;
    }
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
              ((string *)&gtest_ar_,&TestBody::exp_dummy_asset_a);
    ret = CfdAddTargetAmountForFundRawTx
                    (handle_00,fund_handle_00,0,100000000,
                     (char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_),
                     "AzpkHG7iBPzGn3wCoKwEUrNMWA8TCLXTvhK6ftgAmaAGWqDKyDipYSFjsBBcGXKj3Y65Kt9UauCEbftj"
                    );
    std::__cxx11::string::~string((string *)&gtest_ar_);
    tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&tx_fee_amount);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x795,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&tx_fee_amount);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    ret = CfdSetOptionFundRawTx(handle,fund_handle,1,0,0.0,true);
    tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&tx_fee_amount);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x799,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&tx_fee_amount);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    ret = CfdSetOptionFundRawTx(handle,fund_handle,1,0,0.0,true);
    tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&tx_fee_amount);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x79c,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&tx_fee_amount);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    tx_fee_amount = 0;
    append_txout_count = 0;
    output_tx_hex = (char *)0x0;
    ret = CfdFinalizeFundRawTx
                    (handle,fund_handle,
                     "020000000000010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe8700000000"
                     ,1.0,&tx_fee_amount,&append_txout_count,&output_tx_hex);
    local_150.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_150.ptr_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&local_150,&ret);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_150);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_160,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x7a5,pcVar5);
      testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_160);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_150);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    if (ret == 0) {
      local_150.ptr_._0_4_ = 0x7be;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&gtest_ar_,"1982","tx_fee_amount",(int *)&local_150,&tx_fee_amount);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_150);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7a7,pcVar5);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_150);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      local_150.ptr_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar_,"1","append_txout_count",(int *)&local_150,
                 &append_txout_count);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_150);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7a9,pcVar5);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_150);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_,"kExpTxData.c_str()","output_tx_hex",
                 TestBody()::kExpTxData_abi_cxx11_._M_dataplus._M_p,output_tx_hex);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_150);
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x7aa,pcVar5);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_150);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      CfdFreeStringBuffer(output_tx_hex);
    }
    else {
      ret = CfdGetLastErrorCode(handle);
      if (ret != 0) {
        local_150.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        ret = CfdGetLastErrorMessage(handle,(char **)&local_150);
        local_160.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&local_160,&ret);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_160);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x7b1,pcVar5);
          testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_160);
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_160);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        pcVar5 = "";
        testing::internal::CmpHelperSTREQ
                  ((internal *)&gtest_ar_,"\"\"","str_buffer","",(char *)local_150.ptr_);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_160);
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x7b2,pcVar5);
          testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_160);
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_160);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        CfdFreeStringBuffer((char *)local_150.ptr_);
      }
    }
  }
  ret = CfdFreeFundRawTxHandle(handle,fund_handle);
  tx_fee_amount = tx_fee_amount & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar_,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee_amount,&ret);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&tx_fee_amount);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_tx_hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x7b9,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&output_tx_hex,(Message *)&tx_fee_amount);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_tx_hex);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tx_fee_amount);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  ret = CfdFreeHandle(handle);
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fund_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x7c1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fund_handle,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fund_handle);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(cfdcapi_transaction, FundRawTransaction_Check2) {
  // from cfd-go
  struct CfdTestFundElementsUtxoVector {
    std::string txid;
    uint32_t vout;
    int64_t amount;
    std::string asset;
    std::string descriptor;
  };
  static ConfidentialAssetId exp_dummy_asset_a("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  static const std::vector<CfdTestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    {
      "2bc630021e76ab6bd7f8da54b0c59381e0265b093629e4384207030adba99775",
      0,
      150000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh([b8f7f84b/0'/0'/4']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5",
    },
    {
      "42120c9e8adc1d0f0d843617a0c91d699a1eb67fb744dde21103d6423fa5c8c5",
      1,
      150000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh([b8f7f84b/0'/0'/4']029b382de02d1753b04f29e743ec988a7585e16f023d7c76fcb468133781465282))#jm9lh5q5",
    },
  };
  static const std::string kExpTxData = "0200000000027597a9db0a03074238e42936095b26e08193c5b054daf8d76bab761e0230c62b0000000000ffffffffc5c8a53f42d60311e2dd44b77fb61e9a691dc9a01736840d0f1ddc8a9e0c12420100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007be00000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000bebba420230646d493a7ed8cb0091ad6e8feedcc9cd17a9162e61b7cff7929697792ef64217a91497dfc3937ad66e142925a76489eebc75358bca338700000000";
  // static const std::string kExpTxData = "0200000000027597a9db0a03074238e42936095b26e08193c5b054daf8d76bab761e0230c62b0000000000ffffffffc5c8a53f42d60311e2dd44b77fb61e9a691dc9a01736840d0f1ddc8a9e0c12420100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007ae00000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000000bebba520230646d493a7ed8cb0091ad6e8feedcc9cd17a9162e61b7cff7929697792ef64217a91497dfc3937ad66e142925a76489eebc75358bca338700000000";

  CfdInitialize();
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  try {
    const char* tx = "020000000000010125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5e100036a2e218bb512a3e65c80b59fec57aee428b7512276bcfa366c154dd7262994c817a914363273e2f851bda01e24cda41ba748b8d1f54cfe8700000000";
    uint32_t target_asset_count = 1;
    auto fee_asset = exp_dummy_asset_a.GetHex();
    void* fund_handle = nullptr;
    ret = CfdInitializeFundRawTx(
        handle, kCfdNetworkElementsRegtest, target_asset_count,
        fee_asset.c_str(), &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_NE(nullptr, fund_handle);
    if (ret == kCfdSuccess) {
      for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
        ret = CfdAddUtxoForFundRawTx(
            handle, fund_handle,
            test_data.txid.c_str(), test_data.vout,
            test_data.amount,
            test_data.descriptor.c_str(),
            test_data.asset.c_str());
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdAddTargetAmountForFundRawTx(handle, fund_handle, 0, 100000000,
          exp_dummy_asset_a.GetHex().c_str(),
          "AzpkHG7iBPzGn3wCoKwEUrNMWA8TCLXTvhK6ftgAmaAGWqDKyDipYSFjsBBcGXKj3Y65Kt9UauCEbftj");
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
          0, 0, true);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdSetOptionFundRawTx(handle, fund_handle, kCfdFundTxIsBlind,
          0, 0, true);
      EXPECT_EQ(kCfdSuccess, ret);

      int64_t tx_fee_amount = 0;
      uint32_t append_txout_count = 0;
      char* output_tx_hex = nullptr;
      double effective_fee_rate = 1.0;
      ret = CfdFinalizeFundRawTx(handle, fund_handle, tx,
          effective_fee_rate, &tx_fee_amount, &append_txout_count,
          &output_tx_hex);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_EQ(1982, tx_fee_amount);
        // EXPECT_EQ(1966, tx_fee_amount);
        EXPECT_EQ(1, append_txout_count);
        EXPECT_STREQ(kExpTxData.c_str(), output_tx_hex);
        CfdFreeStringBuffer(output_tx_hex);
      } else {
        ret = CfdGetLastErrorCode(handle);
        if (ret != kCfdSuccess) {
          char* str_buffer = NULL;
          ret = CfdGetLastErrorMessage(handle, &str_buffer);
          EXPECT_EQ(kCfdSuccess, ret);
          EXPECT_STREQ("", str_buffer);
          CfdFreeStringBuffer(str_buffer);
          str_buffer = NULL;
        }
      }
    }
    ret = CfdFreeFundRawTxHandle(handle, fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);

    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}